

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketConnectionTestCase.cpp
# Opt level: O1

void __thiscall
SuiteSocketConnectionTests::TestSessionConnectionReadSocket_SocketException_ReadFailedHelper::
RunImpl(TestSessionConnectionReadSocket_SocketException_ReadFailedHelper *this)

{
  TestResults *this_00;
  char cVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  SocketConnector connector;
  TestDetails local_140;
  SocketConnector local_120 [272];
  
  TestSessionConnection::getSession(&this->super_TestSessionConnection);
  FIX::Session::disconnect();
  FIX::SocketConnector::SocketConnector(local_120,0);
  cVar1 = FIX::SocketConnection::read
                    ((SocketConnector *)
                     (this->super_TestSessionConnection).pSocketConnection._M_t.
                     super___uniq_ptr_impl<FIX::SocketConnection,_std::default_delete<FIX::SocketConnection>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_FIX::SocketConnection_*,_std::default_delete<FIX::SocketConnection>_>
                     .super__Head_base<0UL,_FIX::SocketConnection_*,_false>._M_head_impl);
  if (cVar1 != '\0') {
    ppTVar2 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar2;
    ppTVar3 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_140,*ppTVar3,0x10b);
    UnitTest::TestResults::OnTestFailure(this_00,&local_140,"!pSocketConnection->read(connector)");
  }
  FIX::SocketMonitor::~SocketMonitor((SocketMonitor *)local_120);
  return;
}

Assistant:

TEST_FIXTURE(TestSessionConnection, ReadSocket_SocketException_ReadFailed)
  {
    Session* session = getSession();
    session->disconnect();

    SocketConnector connector;
    CHECK(!pSocketConnection->read(connector));
  }